

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O0

NpyArray * cnpy::npz_load(NpyArray *__return_storage_ptr__,string *fname,string *varname)

{
  __type_conflict1 _Var1;
  char *__filename;
  runtime_error *prVar2;
  reference pvVar3;
  size_t sVar4;
  ushort *puVar5;
  ulong uVar6;
  void *__ptr;
  uint *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  uint local_fc;
  undefined1 local_f5;
  uint32_t size;
  uint32_t local_f0;
  uint32_t uncompr_bytes;
  uint32_t compr_bytes;
  uint16_t compr_method;
  uint16_t extra_field_len;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined8 local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  undefined8 local_c0;
  size_t local_b8;
  size_t vname_res;
  undefined1 local_a8 [8];
  string vname;
  uint16_t name_len;
  size_t header_res;
  undefined1 local_70 [8];
  vector<char,_std::allocator<char>_> local_header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  FILE *local_28;
  FILE *fp;
  string *varname_local;
  string *fname_local;
  NpyArray *array;
  
  fp = (FILE *)varname;
  varname_local = fname;
  fname_local = (string *)__return_storage_ptr__;
  __filename = (char *)std::__cxx11::string::c_str();
  local_28 = fopen(__filename,"rb");
  if (local_28 == (FILE *)0x0) {
    local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"npz_load: Unable to open file ",fname);
    std::runtime_error::runtime_error(prVar2,(string *)&local_48);
    local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_1_ = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_70,0x1e,
               (allocator_type *)((long)&header_res + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&header_res + 7));
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_70,0);
    sVar4 = fread(pvVar3,1,0x1e,local_28);
    if (sVar4 != 0x1e) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"npz_load: failed fread");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_70,2);
    if ((*pvVar3 == '\x03') &&
       (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_70,3), *pvVar3 == '\x04'))
    {
      puVar5 = (ushort *)
               std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_70,0x1a);
      vname.field_2._10_2_ = *puVar5;
      uVar6 = (ulong)(ushort)vname.field_2._10_2_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_a8,uVar6,' ',(allocator *)((long)&vname_res + 7))
      ;
      std::allocator<char>::~allocator((allocator<char> *)((long)&vname_res + 7));
      __ptr = (void *)std::__cxx11::string::operator[]((ulong)local_a8);
      local_b8 = fread(__ptr,1,(ulong)(ushort)vname.field_2._10_2_,local_28);
      if (local_b8 != (ushort)vname.field_2._10_2_) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"npz_load: failed fread");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_d0._M_current = (char *)std::__cxx11::string::end();
      local_c8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_d0,4);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_c0,&local_c8);
      local_e0._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_d8,&local_e0);
      _compr_bytes = std::__cxx11::string::erase(local_a8,local_c0,local_d8);
      puVar5 = (ushort *)
               std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_70,0x1c);
      uncompr_bytes._2_2_ = *puVar5;
      fseek(local_28,(ulong)uncompr_bytes._2_2_,1);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_70,0);
      uncompr_bytes._0_2_ = *(short *)(pvVar3 + 8);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_70,0);
      local_f0 = *(uint32_t *)(pvVar3 + 0x12);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_70,0);
      size = *(uint32_t *)(pvVar3 + 0x16);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,varname);
      if (_Var1) {
        local_f5 = 0;
        if ((short)uncompr_bytes == 0) {
          load_the_npy_file(__return_storage_ptr__,(FILE *)local_28);
        }
        else {
          load_the_npz_array(__return_storage_ptr__,(FILE *)local_28,local_f0,size);
        }
        fclose(local_28);
        vname.field_2._12_4_ = 1;
        local_f5 = 1;
      }
      else {
        puVar7 = (uint *)std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)local_70,0x16);
        local_fc = *puVar7;
        fseek(local_28,(ulong)local_fc,1);
        vname.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)local_a8);
    }
    else {
      vname.field_2._12_4_ = 3;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_70);
  } while (vname.field_2._12_4_ == 0);
  if (vname.field_2._12_4_ != 1) {
    fclose(local_28);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_160,"npz_load: Variable name ",varname);
    std::operator+(&local_140,&local_160," not found in ");
    std::operator+(&local_120,&local_140,fname);
    std::runtime_error::runtime_error(prVar2,(string *)&local_120);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

cnpy::NpyArray cnpy::npz_load(std::string fname, std::string varname) {
    FILE* fp = fopen(fname.c_str(),"rb");

    if(!fp) throw std::runtime_error("npz_load: Unable to open file "+fname);

    while(1) {
        std::vector<char> local_header(30);
        size_t header_res = fread(&local_header[0],sizeof(char),30,fp);
        if(header_res != 30)
            throw std::runtime_error("npz_load: failed fread");

        //if we've reached the global header, stop reading
        if(local_header[2] != 0x03 || local_header[3] != 0x04) break;

        //read in the variable name
        uint16_t name_len = *(uint16_t*) &local_header[26];
        std::string vname(name_len,' ');
        size_t vname_res = fread(&vname[0],sizeof(char),name_len,fp);      
        if(vname_res != name_len)
            throw std::runtime_error("npz_load: failed fread");
        vname.erase(vname.end()-4,vname.end()); //erase the lagging .npy

        //read in the extra field
        uint16_t extra_field_len = *(uint16_t*) &local_header[28];
        fseek(fp,extra_field_len,SEEK_CUR); //skip past the extra field
        
        uint16_t compr_method = *reinterpret_cast<uint16_t*>(&local_header[0]+8);
        uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
        uint32_t uncompr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+22);

        if(vname == varname) {
            NpyArray array  = (compr_method == 0) ? load_the_npy_file(fp) : load_the_npz_array(fp,compr_bytes,uncompr_bytes);
            fclose(fp);
            return array;
        }
        else {
            //skip past the data
            uint32_t size = *(uint32_t*) &local_header[22];
            fseek(fp,size,SEEK_CUR);
        }
    }

    fclose(fp);

    //if we get here, we haven't found the variable in the file
    throw std::runtime_error("npz_load: Variable name "+varname+" not found in "+fname);
}